

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_done_sending(Curl_easy *data,SingleRequest *k)

{
  connectdata *conn_00;
  CURLcode result;
  connectdata *conn;
  SingleRequest *k_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  k->keepon = k->keepon & 0xfffffffd;
  Curl_http2_done_sending(data,conn_00);
  if (((*(uint *)&(conn_00->bits).field_0x4 >> 0x11 & 1) == 0) ||
     (data_local._4_4_ = Curl_readrewind(data), data_local._4_4_ == CURLE_OK)) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_done_sending(struct Curl_easy *data,
                           struct SingleRequest *k)
{
  struct connectdata *conn = data->conn;
  k->keepon &= ~KEEP_SEND; /* we're done writing */

  /* These functions should be moved into the handler struct! */
  Curl_http2_done_sending(data, conn);
  Curl_quic_done_sending(data);

  if(conn->bits.rewindaftersend) {
    CURLcode result = Curl_readrewind(data);
    if(result)
      return result;
  }
  return CURLE_OK;
}